

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_parseMessageChainList
          (sysbvm_context_t *context,sysbvm_parser_state_t *state,size_t startPosition,
          sysbvm_tuple_t receiver,sysbvm_tuple_t firstChainedMessage)

{
  size_t sVar1;
  sysbvm_parser_state_t *psVar2;
  int iVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t array;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t sourcePosition;
  size_t endPosition;
  sysbvm_tuple_t chainedSourcePosition_2;
  sysbvm_tuple_t arguments_2;
  sysbvm_tuple_t selector_2;
  size_t chainedStartPosition_2;
  sysbvm_tuple_t arguments_1;
  sysbvm_tuple_t chainedSourcePosition_1;
  sysbvm_tuple_t argument;
  sysbvm_tuple_t selector_1;
  size_t chainedStartPosition_1;
  sysbvm_tuple_t chainedSourcePosition;
  sysbvm_tuple_t arguments;
  sysbvm_tuple_t selector;
  size_t chainedStartPosition;
  sysbvm_tuple_t chainedMessageList;
  sysbvm_tuple_t firstChainedMessage_local;
  sysbvm_tuple_t receiver_local;
  size_t startPosition_local;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  chainedMessageList = firstChainedMessage;
  firstChainedMessage_local = receiver;
  receiver_local = startPosition;
  startPosition_local = (size_t)state;
  state_local = (sysbvm_parser_state_t *)context;
  chainedStartPosition = sysbvm_orderedCollection_create(context);
  sysbvm_orderedCollection_add
            ((sysbvm_context_t *)state_local,chainedStartPosition,chainedMessageList);
  while (iVar3 = sysbvm_parser_lookKindAt((sysbvm_parser_state_t *)startPosition_local,0),
        iVar3 == 0x16) {
    *(long *)(startPosition_local + 0x10) = *(long *)(startPosition_local + 0x10) + 1;
    iVar3 = sysbvm_parser_lookKindAt((sysbvm_parser_state_t *)startPosition_local,0);
    psVar2 = state_local;
    sVar1 = chainedStartPosition;
    if (iVar3 == 2) {
      sVar1 = *(size_t *)(startPosition_local + 0x10);
      sVar6 = sysbvm_parser_parseLiteralTokenValue
                        ((sysbvm_context_t *)state_local,
                         (sysbvm_parser_state_t *)startPosition_local);
      sVar4 = sysbvm_array_create((sysbvm_context_t *)state_local,0);
      sVar5 = sysbvm_parser_makeSourcePositionForTokenRange
                        ((sysbvm_context_t *)state_local,*(sysbvm_tuple_t *)startPosition_local,
                         *(sysbvm_tuple_t *)(startPosition_local + 8),sVar1,
                         *(size_t *)(startPosition_local + 0x10));
      psVar2 = state_local;
      sVar1 = chainedStartPosition;
      sVar6 = sysbvm_astMessageChainMessageNode_create
                        ((sysbvm_context_t *)state_local,sVar5,sVar6,sVar4);
      sysbvm_orderedCollection_add((sysbvm_context_t *)psVar2,sVar1,sVar6);
    }
    else if (iVar3 == 4) {
      selector = *(sysbvm_tuple_t *)(startPosition_local + 0x10);
      arguments = 0;
      chainedSourcePosition = 0;
      sysbvm_parser_parseKeywordMessageParts
                ((sysbvm_context_t *)state_local,(sysbvm_parser_state_t *)startPosition_local,
                 &arguments,&chainedSourcePosition);
      sVar6 = sysbvm_parser_makeSourcePositionForTokenRange
                        ((sysbvm_context_t *)state_local,*(sysbvm_tuple_t *)startPosition_local,
                         *(sysbvm_tuple_t *)(startPosition_local + 8),selector,
                         *(size_t *)(startPosition_local + 0x10));
      psVar2 = state_local;
      sVar1 = chainedStartPosition;
      sVar6 = sysbvm_astMessageChainMessageNode_create
                        ((sysbvm_context_t *)state_local,sVar6,arguments,chainedSourcePosition);
      sysbvm_orderedCollection_add((sysbvm_context_t *)psVar2,sVar1,sVar6);
    }
    else if (((iVar3 == 6) || (iVar3 - 0xfU < 3)) || (iVar3 == 0x14)) {
      sVar1 = *(size_t *)(startPosition_local + 0x10);
      sVar6 = sysbvm_parser_parseLiteralTokenValue
                        ((sysbvm_context_t *)state_local,
                         (sysbvm_parser_state_t *)startPosition_local);
      sVar4 = sysbvm_parser_parseBinaryExpression
                        ((sysbvm_context_t *)state_local,
                         (sysbvm_parser_state_t *)startPosition_local);
      sVar5 = sysbvm_parser_makeSourcePositionForTokenRange
                        ((sysbvm_context_t *)state_local,*(sysbvm_tuple_t *)startPosition_local,
                         *(sysbvm_tuple_t *)(startPosition_local + 8),sVar1,
                         *(size_t *)(startPosition_local + 0x10));
      array = sysbvm_array_create((sysbvm_context_t *)state_local,1);
      sysbvm_array_atPut(array,0,sVar4);
      psVar2 = state_local;
      sVar1 = chainedStartPosition;
      sVar6 = sysbvm_astMessageChainMessageNode_create
                        ((sysbvm_context_t *)state_local,sVar5,sVar6,array);
      sysbvm_orderedCollection_add((sysbvm_context_t *)psVar2,sVar1,sVar6);
    }
    else {
      sVar6 = sysbvm_parser_makeSourcePositionForParserState
                        ((sysbvm_context_t *)state_local,
                         (sysbvm_parser_state_t *)startPosition_local);
      sVar6 = sysbvm_astErrorNode_createWithCString
                        ((sysbvm_context_t *)psVar2,sVar6,"Expected a chained message.");
      sysbvm_orderedCollection_add((sysbvm_context_t *)psVar2,sVar1,sVar6);
      *(long *)(startPosition_local + 0x10) = *(long *)(startPosition_local + 0x10) + 1;
    }
  }
  sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                    ((sysbvm_context_t *)state_local,*(sysbvm_tuple_t *)startPosition_local,
                     *(sysbvm_tuple_t *)(startPosition_local + 8),receiver_local,
                     *(size_t *)(startPosition_local + 0x10));
  psVar2 = state_local;
  sVar6 = firstChainedMessage_local;
  sVar5 = sysbvm_orderedCollection_asArray((sysbvm_context_t *)state_local,chainedStartPosition);
  sVar6 = sysbvm_astMessageChainNode_create((sysbvm_context_t *)psVar2,sVar4,sVar6,sVar5);
  return sVar6;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseMessageChainList(sysbvm_context_t *context, sysbvm_parser_state_t *state, size_t startPosition, sysbvm_tuple_t receiver, sysbvm_tuple_t firstChainedMessage)
{
    sysbvm_tuple_t chainedMessageList = sysbvm_orderedCollection_create(context);
    sysbvm_orderedCollection_add(context, chainedMessageList, firstChainedMessage);

    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_SEMICOLON)
    {
        ++state->tokenPosition;
        switch(sysbvm_parser_lookKindAt(state, 0))
        {
        case SYSBVM_TOKEN_KIND_KEYWORD:
            {
                size_t chainedStartPosition = state->tokenPosition;
                sysbvm_tuple_t selector = SYSBVM_NULL_TUPLE;
                sysbvm_tuple_t arguments = SYSBVM_NULL_TUPLE;

                sysbvm_parser_parseKeywordMessageParts(context, state, &selector, &arguments);
                sysbvm_tuple_t chainedSourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, chainedStartPosition, state->tokenPosition);
                sysbvm_orderedCollection_add(context, chainedMessageList, sysbvm_astMessageChainMessageNode_create(context, chainedSourcePosition, selector, arguments));
            }
            break;
        
        case SYSBVM_TOKEN_KIND_OPERATOR:
        case SYSBVM_TOKEN_KIND_BAR:
        case SYSBVM_TOKEN_KIND_STAR:
        case SYSBVM_TOKEN_KIND_LESS_THAN:
        case SYSBVM_TOKEN_KIND_GREATER_THAN:
            {
                size_t chainedStartPosition = state->tokenPosition;
                sysbvm_tuple_t selector = sysbvm_parser_parseLiteralTokenValue(context, state);
                sysbvm_tuple_t argument = sysbvm_parser_parseBinaryExpression(context, state);
                sysbvm_tuple_t chainedSourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, chainedStartPosition, state->tokenPosition);

                sysbvm_tuple_t arguments = sysbvm_array_create(context, 1);
                sysbvm_array_atPut(arguments, 0, argument);
                sysbvm_orderedCollection_add(context, chainedMessageList, sysbvm_astMessageChainMessageNode_create(context, chainedSourcePosition, selector, arguments));
            }
            break;
        case SYSBVM_TOKEN_KIND_IDENTIFIER:
            {
                size_t chainedStartPosition = state->tokenPosition;
                sysbvm_tuple_t selector = sysbvm_parser_parseLiteralTokenValue(context, state);
                sysbvm_tuple_t arguments = sysbvm_array_create(context, 0);
                sysbvm_tuple_t chainedSourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, chainedStartPosition, state->tokenPosition);
                sysbvm_orderedCollection_add(context, chainedMessageList, sysbvm_astMessageChainMessageNode_create(context, chainedSourcePosition, selector, arguments));
            }
            break;
        default:
            sysbvm_orderedCollection_add(context, chainedMessageList, sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a chained message."));
            ++state->tokenPosition;
            break;
        }
    }

    size_t endPosition = state->tokenPosition;
    sysbvm_tuple_t sourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition);
    return sysbvm_astMessageChainNode_create(context, sourcePosition, receiver, sysbvm_orderedCollection_asArray(context, chainedMessageList));
}